

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O2

void __thiscall VDasher::cubicTo(VDasher *this,VPointF *cp1,VPointF *cp2,VPointF *e)

{
  float fVar1;
  float len;
  VBezier b;
  VBezier right;
  VBezier left;
  VPointF local_b0;
  VPointF local_a8;
  VPointF local_a0;
  undefined1 local_98 [16];
  VPointF local_88;
  VPointF VStack_80;
  VPointF local_70;
  VPointF VStack_68;
  VPointF local_60;
  VPointF VStack_58;
  undefined1 local_50 [16];
  VPointF local_40;
  VPointF VStack_38;
  
  VBezier::fromPoints(&this->mCurPt,cp1,cp2,e);
  fVar1 = VBezier::length((VBezier *)local_98);
  len = this->mCurrentLength;
  if (fVar1 <= len) {
    this->mCurrentLength = len - fVar1;
    addCubic(this,cp1,cp2,e);
  }
  else {
    while (len < fVar1) {
      fVar1 = fVar1 - len;
      VBezier::splitAtLength((VBezier *)local_98,len,(VBezier *)local_50,(VBezier *)&local_70);
      local_a0.mx = (float)local_50._8_4_;
      local_a0.my = (float)local_50._12_4_;
      local_a8 = local_40;
      local_b0 = VStack_38;
      addCubic(this,&local_a0,&local_a8,&local_b0);
      updateActiveSegment(this);
      local_98._8_8_ = VStack_68;
      local_88 = local_60;
      VStack_80 = VStack_58;
      this->mCurPt = local_70;
      len = this->mCurrentLength;
    }
    if (fVar1 <= 0.1) goto LAB_0010b0a5;
    this->mCurrentLength = len - fVar1;
    local_a0.mx = (float)local_98._8_4_;
    local_a0.my = (float)local_98._12_4_;
    local_a8 = local_88;
    local_b0 = VStack_80;
    addCubic(this,&local_a0,&local_a8,&local_b0);
  }
  len = this->mCurrentLength;
LAB_0010b0a5:
  if (len < 0.1) {
    updateActiveSegment(this);
  }
  this->mCurPt = *e;
  return;
}

Assistant:

void VDasher::cubicTo(const VPointF &cp1, const VPointF &cp2, const VPointF &e)
{
    VBezier left, right;
    VBezier b = VBezier::fromPoints(mCurPt, cp1, cp2, e);
    float   bezLen = b.length();

    if (bezLen <= mCurrentLength) {
        mCurrentLength -= bezLen;
        addCubic(cp1, cp2, e);
    } else {
        while (bezLen > mCurrentLength) {
            bezLen -= mCurrentLength;
            b.splitAtLength(mCurrentLength, &left, &right);

            addCubic(left.pt2(), left.pt3(), left.pt4());
            updateActiveSegment();

            b = right;
            mCurPt = b.pt1();
        }
        // handle remainder
        if (bezLen > tolerance) {
            mCurrentLength -= bezLen;
            addCubic(b.pt2(), b.pt3(), b.pt4());
        }
    }

    if (mCurrentLength < tolerance) updateActiveSegment();

    mCurPt = e;
}